

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ay8910.c
# Opt level: O0

void ay8910_set_stereo_mask(void *chip,UINT32 StereoMask)

{
  byte local_21;
  UINT8 CurChn;
  ay8910_context *psg;
  UINT32 StereoMask_local;
  void *chip_local;
  
  psg._4_4_ = StereoMask;
  for (local_21 = 0; local_21 < 3; local_21 = local_21 + 1) {
    *(byte *)((long)chip + (ulong)local_21 + 0x2b8) = (byte)psg._4_4_ & 3;
    psg._4_4_ = psg._4_4_ >> 2;
  }
  return;
}

Assistant:

void ay8910_set_stereo_mask(void *chip, UINT32 StereoMask)
{
	ay8910_context *psg = (ay8910_context *)chip;
	UINT8 CurChn;
	
	for (CurChn = 0; CurChn < NUM_CHANNELS; CurChn ++)
	{
		psg->StereoMask[CurChn] = StereoMask & 0x03;
		StereoMask >>= 2;
	}
	
	return;
}